

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::post_init_state(NavierStokesBase *this)

{
  ostringstream *poVar1;
  pointer pSVar2;
  TimeCenter TVar3;
  long lVar4;
  NavierStokesBase *pNVar5;
  int k;
  int lev;
  uint uVar6;
  bool bVar7;
  double dVar8;
  Real cur_divu_time;
  Print local_1a0;
  
  lev = *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
                 field_0x8c;
  if (have_divu == 0) {
    pSVar2 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar3 = amrex::StateDescriptor::timeType(pSVar2[1].desc);
    if (TVar3 == Point) {
      cur_divu_time = pSVar2[1].new_time.stop;
      goto LAB_003487ba;
    }
    dVar8 = pSVar2[1].new_time.start + pSVar2[1].new_time.stop;
  }
  else {
    lVar4 = (long)Divu_Type;
    pSVar2 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar3 = amrex::StateDescriptor::timeType(pSVar2[lVar4].desc);
    if (TVar3 == Point) {
      cur_divu_time = pSVar2[lVar4].new_time.stop;
      goto LAB_003487ba;
    }
    dVar8 = pSVar2[lVar4].new_time.start + pSVar2[lVar4].new_time.stop;
  }
  cur_divu_time = dVar8 * 0.5;
LAB_003487ba:
  if (do_init_vort_proj != 0) {
    amrex::Abort_host(
                     "NavierStokesBase::post_init_state(): initialVorticityProject not tested with new Gradp!!! See comments Projection::initialVorticityProject.\n"
                     );
    if (verbose != 0) {
      local_1a0.os = amrex::OutStream();
      local_1a0.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1a0.ss;
      local_1a0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1a0.field_0x18 + *(long *)(local_1a0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1a0.os + *(long *)(*(long *)local_1a0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"calling initialVorticityProject",0x1f);
      std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      amrex::Print::~Print(&local_1a0);
    }
    Projection::initialVorticityProject(projector,0);
    if (verbose != 0) {
      local_1a0.os = amrex::OutStream();
      local_1a0.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1a0.ss;
      local_1a0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1a0.field_0x18 + *(long *)(local_1a0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1a0.os + *(long *)(*(long *)local_1a0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"done calling initialVorticityProject",0x24);
      std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      amrex::Print::~Print(&local_1a0);
    }
  }
  if (projector != (Projection *)0x0 && do_init_proj != 0) {
    if (verbose != 0) {
      local_1a0.os = amrex::OutStream();
      local_1a0.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1a0.ss;
      local_1a0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1a0.field_0x18 + *(long *)(local_1a0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1a0.os + *(long *)(*(long *)local_1a0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"calling initialVelocityProject",0x1e);
      std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      amrex::Print::~Print(&local_1a0);
    }
    Projection::initialVelocityProject(projector,0,cur_divu_time,have_divu,init_vel_iter);
    if (verbose != 0) {
      local_1a0.os = amrex::OutStream();
      local_1a0.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1a0.ss;
      local_1a0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1a0.field_0x18 + *(long *)(local_1a0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1a0.os + *(long *)(*(long *)local_1a0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"done calling initialVelocityProject",0x23);
      std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      amrex::Print::~Print(&local_1a0);
    }
  }
  initial_step = 1;
  if (0 < lev) {
    uVar6 = lev + 1;
    do {
      pNVar5 = getLevel(this,uVar6 - 2);
      (*(pNVar5->super_AmrLevel)._vptr_AmrLevel[0x2c])(pNVar5);
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  if (((do_init_proj != 0) && (projector != (Projection *)0x0)) && (gravity != 0.0)) {
    if (verbose != 0) {
      local_1a0.os = amrex::OutStream();
      local_1a0.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1a0.ss;
      local_1a0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1a0.field_0x18 + *(long *)(local_1a0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1a0.os + *(long *)(*(long *)local_1a0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"calling initialPressureProject",0x1e);
      std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      amrex::Print::~Print(&local_1a0);
    }
    Projection::initialPressureProject(projector,0);
    if (verbose != 0) {
      local_1a0.os = amrex::OutStream();
      local_1a0.rank = *(int *)(DAT_00816950 + -0x30);
      poVar1 = &local_1a0.ss;
      local_1a0.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1a0.field_0x18 + *(long *)(local_1a0._16_8_ + -0x18)) =
           *(undefined8 *)(local_1a0.os + *(long *)(*(long *)local_1a0.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"done calling initialPressureProject",0x23);
      std::ios::widen((char)*(undefined8 *)(local_1a0._16_8_ + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      amrex::Print::~Print(&local_1a0);
    }
  }
  if (-1 < lev && do_init_proj == 0) {
    do {
      initOldFromNew(this,1,lev);
      initOldFromNew(this,2,lev);
      bVar7 = lev != 0;
      lev = lev + -1;
    } while (bVar7);
  }
  return;
}

Assistant:

void
NavierStokesBase::post_init_state ()
{
    const int finest_level = parent->finestLevel();
    const Real divu_time   = have_divu ? state[Divu_Type].curTime()
                                       : state[Press_Type].curTime();

    if (do_init_vort_proj)
    {
        amrex::Abort("NavierStokesBase::post_init_state(): initialVorticityProject not tested with new Gradp!!! See comments Projection::initialVorticityProject.\n");
        //
	// NOTE: this assumes have_divu == 0.
	// Only used if vorticity is used to initialize the velocity field.
        //
        AMREX_ASSERT(!(projector == 0));

	if (verbose) amrex::Print() << "calling initialVorticityProject" << std::endl;

	projector->initialVorticityProject(0);

	if (verbose) amrex::Print() << "done calling initialVorticityProject" << std::endl;
    }

    if (do_init_proj && projector)
    {
      //
      // Do sync project to define divergence free velocity field.
      //
      if (verbose) amrex::Print() << "calling initialVelocityProject" << std::endl;

      projector->initialVelocityProject(0,divu_time,have_divu,init_vel_iter);

      if (verbose) amrex::Print() << "done calling initialVelocityProject" << std::endl;
    }

    NavierStokesBase::initial_step = true;
    //
    // Average velocity and scalar data down from finer levels
    // so that conserved data is consistant between levels.
    // This might not be the most efficient way of doing things
    // (since initialVelocityProject will average down vel, P and Gradp),
    // but it does ensure everything is averaged down for all cases
    // (e.g. initialVelocityProject doesn't get called or init_vel_iter<=0).
    //
    for (int k = finest_level-1; k>= 0; k--)
    {
      getLevel(k).avgDown();
    }

    if (do_init_proj && projector && (std::fabs(gravity)) > 0.){
      //
      // Do projection to establish initially hydrostatic pressure field.
      //
      if (verbose) amrex::Print() << "calling initialPressureProject" << std::endl;

      projector->initialPressureProject(0);

      if (verbose) amrex::Print() << "done calling initialPressureProject" << std::endl;
    }
    //
    // Make sure there's not NANs in old pressure field.
    // End up with P_old = P_new as is the case when exiting initialPressureProject
    //
    if(!do_init_proj)
    {
      for (int k = finest_level; k>= 0; k--)
      {
	initOldFromNew(Press_Type, k);
	initOldFromNew(Gradp_Type, k);
    }
    }
}